

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reap.cpp
# Opt level: O3

uint __thiscall Reap::pop(Reap *this)

{
  pointer *ppuVar1;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  iterator __position;
  uint uVar2;
  uint uVar3;
  iterator p;
  ulong uVar4;
  uint *puVar5;
  uint *puVar6;
  uint *puVar7;
  uint unaff_EBP;
  uint *puVar8;
  iterator p_1;
  uint other;
  uint local_54;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_50;
  uint *local_48;
  ulong local_40;
  uint *local_38;
  
  uVar2 = this->min_bucket;
  local_40 = (ulong)uVar2;
  do {
    uVar4 = local_40 & 0xffffffff;
    puVar6 = this->buckets[uVar4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar8 = this->buckets[uVar4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (puVar6 == puVar8) {
      uVar2 = (int)local_40 + 1;
      local_40 = (ulong)uVar2;
      this->min_bucket = uVar2;
    }
    else {
      local_50 = this->buckets + uVar4;
      local_48 = puVar6;
      if ((int)local_40 == 0) {
        unaff_EBP = this->last_deleted;
        ppuVar1 = &this->buckets[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + -1;
      }
      else {
        unaff_EBP = 0xffffffff;
        puVar5 = puVar6;
        puVar7 = puVar6;
        do {
          if (*puVar5 < unaff_EBP) {
            puVar7 = puVar5;
            unaff_EBP = *puVar5;
          }
          puVar5 = puVar5 + 1;
          local_38 = puVar8;
        } while (puVar5 != puVar8);
        do {
          if (puVar6 != puVar7) {
            local_54 = *puVar6;
            uVar2 = local_54 ^ unaff_EBP;
            if (uVar2 == 0) {
              uVar3 = 0x20;
            }
            else {
              uVar3 = 0x1f;
              if (uVar2 != 0) {
                for (; uVar2 >> uVar3 == 0; uVar3 = uVar3 - 1) {
                }
              }
              uVar3 = uVar3 ^ 0x1f;
            }
            uVar3 = 0x20 - uVar3;
            this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(this->buckets + uVar3);
            __position._M_current = *(uint **)(this_00 + 8);
            if (__position._M_current == *(uint **)(this_00 + 0x10)) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(this_00,__position,&local_54);
              puVar8 = local_38;
            }
            else {
              *__position._M_current = local_54;
              *(uint **)(this_00 + 8) = __position._M_current + 1;
            }
            uVar2 = this->min_bucket;
            if (uVar3 < this->min_bucket) {
              this->min_bucket = uVar3;
              uVar2 = uVar3;
            }
          }
          puVar6 = puVar6 + 1;
        } while (puVar6 != puVar8);
        puVar6 = (local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        puVar7 = (local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_finish;
        if (puVar7 != puVar6) {
          (local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = puVar6;
          puVar7 = puVar6;
        }
        if (this->max_bucket == (uint)local_40 && puVar6 == puVar7) {
          this->max_bucket = (uint)local_40 - 1;
        }
      }
      uVar3 = (uint)local_40;
      if ((uVar2 == uVar3) &&
         (uVar2 = uVar3,
         puVar6 == (local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish)) {
        uVar2 = uVar3 + 1;
        if (0x1f < (int)uVar2) {
          uVar2 = 0x20;
        }
        this->min_bucket = uVar2;
      }
      this->num_elements = this->num_elements - 1;
      this->last_deleted = unaff_EBP;
      puVar6 = local_48;
    }
  } while (puVar6 == puVar8);
  return unaff_EBP;
}

Assistant:

unsigned Reap::pop () {
  assert (num_elements > 0);
  unsigned i = min_bucket;
  for (;;) {
    assert (i < 33);
    assert (i <= max_bucket);
    std::vector<unsigned> &s = buckets[i];
    if (s.empty ()) {
      min_bucket = ++i;
      continue;
    }
    unsigned res;
    if (i) {
      res = UINT_MAX;
      const auto begin = std::begin (s);
      const auto end = std::end (s);
      auto q = std::begin (s);
      assert (begin < end);
      for (auto p = begin; p != end; ++p) {
        const unsigned tmp = *p;
        if (tmp >= res)
          continue;
        res = tmp;
        q = p;
      }

      for (auto p = begin; p != end; ++p) {
        if (p == q)
          continue;
        const unsigned other = *p;
        const unsigned diff = other ^ res;
        assert (sizeof (unsigned) == 4);
        const unsigned j = 32 - leading_zeroes_of_unsigned (diff);
        assert (j < i);
        buckets[j].push_back (other);
        if (min_bucket > j)
          min_bucket = j;
      }

      s.clear ();

      if (i && max_bucket == i) {
#ifndef NDEBUG
        for (unsigned j = i + 1; j < 33; j++)
          assert (buckets[j].empty ());
#endif
        if (s.empty ())
          max_bucket = i - 1;
      }
    } else {
      res = last_deleted;
      assert (!buckets[0].empty ());
      assert (buckets[0].at (0) == res);
      buckets[0].pop_back ();
    }

    if (min_bucket == i) {
#ifndef NDEBUG
      for (unsigned j = 0; j < i; j++)
        assert (buckets[j].empty ());
#endif
      if (s.empty ())
        min_bucket = std::min ((int) (i + 1), 32);
    }

    --num_elements;
    assert (last_deleted <= res);
    last_deleted = res;

    return res;
  }
}